

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2a21b2d::ConvolveHorizRSTestBase<unsigned_char>::Prep
          (ConvolveHorizRSTestBase<unsigned_char> *this,ACMRandom *rnd)

{
  TestImage<unsigned_char> *pTVar1;
  
  pTVar1 = this->image_;
  PrepBuffers<unsigned_char>
            (rnd,pTVar1->w_src_,pTVar1->h_,pTVar1->src_stride_,pTVar1->bd_,false,
             (pTVar1->src_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start);
  PrepBuffers<unsigned_char>
            (rnd,pTVar1->w_dst_,pTVar1->h_,pTVar1->dst_stride_,pTVar1->bd_,true,
             (pTVar1->dst_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void Prep(ACMRandom *rnd) {
    assert(rnd);
    image_->Initialize(rnd);
  }